

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::sub_val(CVmObjDate *this,vm_val_t *result,vm_obj_id_t param_3,vm_val_t *val)

{
  int iVar1;
  bignum_t<32> b;
  bignum_t<32> b_00;
  int iVar2;
  vm_obj_id_t vVar3;
  vm_date_ext *pvVar4;
  CVmObject *this_00;
  int *in_RCX;
  vm_val_t *in_RSI;
  CVmObjDate *in_RDI;
  double dVar5;
  double dd;
  bignum_t<32> d;
  bignum_t<32> t2;
  bignum_t<32> d2;
  bignum_t<32> t1;
  bignum_t<32> d1;
  int32_t vdaytime;
  int32_t vdayno;
  CVmObjDate *vdate;
  int32_t daytime;
  int32_t dayno;
  vm_val_t *in_stack_fffffffffffffe98;
  bignum_t<32> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined3 uVar7;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffec0;
  undefined5 in_stack_fffffffffffffed0;
  undefined3 in_stack_fffffffffffffed5;
  undefined4 local_b8;
  undefined1 local_b4;
  
  pvVar4 = get_ext(in_RDI);
  iVar1 = pvVar4->dayno;
  get_ext(in_RDI);
  if ((*in_RCX == 5) && (iVar2 = is_date_obj(0), iVar2 != 0)) {
    this_00 = vm_objp(0);
    get_ext((CVmObjDate *)this_00);
    get_ext((CVmObjDate *)this_00);
    bignum_t<32>::bignum_t(in_stack_fffffffffffffea0,(long)in_stack_fffffffffffffe98);
    bignum_t<32>::bignum_t(in_stack_fffffffffffffea0,(long)in_stack_fffffffffffffe98);
    bignum_t<32>::bignum_t(in_stack_fffffffffffffea0,(long)in_stack_fffffffffffffe98);
    bignum_t<32>::bignum_t(in_stack_fffffffffffffea0,(long)in_stack_fffffffffffffe98);
    bignum_t<32>::operator/
              ((bignum_t<32> *)CONCAT35(in_stack_fffffffffffffed5,in_stack_fffffffffffffed0),
               (long)in_RDI);
    uVar7 = (undefined3)((uint)in_stack_fffffffffffffeac >> 8);
    b.ext._8_8_ = in_RDI;
    b.ext[0] = (char)in_stack_fffffffffffffec0;
    b.ext[1] = (char)((ulong)in_stack_fffffffffffffec0 >> 8);
    b.ext[2] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x10);
    b.ext[3] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x18);
    b.ext[4] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    b.ext[5] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x28);
    b.ext[6] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x30);
    b.ext[7] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x38);
    b.ext[0x10] = (char)in_stack_fffffffffffffed0;
    b.ext[0x11] = (char)((uint5)in_stack_fffffffffffffed0 >> 8);
    b.ext[0x12] = (char)((uint5)in_stack_fffffffffffffed0 >> 0x10);
    b.ext[0x13] = (char)((uint5)in_stack_fffffffffffffed0 >> 0x18);
    b.ext[0x14] = (char)((uint5)in_stack_fffffffffffffed0 >> 0x20);
    bignum_t<32>::operator+=
              ((bignum_t<32> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),b);
    bignum_t<32>::operator/
              ((bignum_t<32> *)CONCAT35(in_stack_fffffffffffffed5,in_stack_fffffffffffffed0),
               (long)in_RDI);
    uVar6 = CONCAT31(uVar7,local_b4);
    b_00.ext._8_8_ = in_RDI;
    b_00.ext[0] = (char)in_stack_fffffffffffffec0;
    b_00.ext[1] = (char)((ulong)in_stack_fffffffffffffec0 >> 8);
    b_00.ext[2] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x10);
    b_00.ext[3] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x18);
    b_00.ext[4] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    b_00.ext[5] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x28);
    b_00.ext[6] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x30);
    b_00.ext[7] = (char)((ulong)in_stack_fffffffffffffec0 >> 0x38);
    b_00.ext[0x10] = (char)in_stack_fffffffffffffed0;
    b_00.ext[0x11] = (char)((uint5)in_stack_fffffffffffffed0 >> 8);
    b_00.ext[0x12] = (char)((uint5)in_stack_fffffffffffffed0 >> 0x10);
    b_00.ext[0x13] = (char)((uint5)in_stack_fffffffffffffed0 >> 0x18);
    b_00.ext[0x14] = (char)((uint5)in_stack_fffffffffffffed0 >> 0x20);
    bignum_t<32>::operator+=
              ((bignum_t<32> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),b_00);
    bignum_t<32>::operator-
              ((bignum_t<32> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (bignum_t<32> *)CONCAT44(uVar6,local_b8));
    vVar3 = CVmObjBigNum::create<32>
                      (in_stack_fffffffffffffeb4,(bignum_t<32> *)CONCAT44(uVar6,local_b8));
    vm_val_t::set_obj(in_RSI,vVar3);
  }
  else {
    if (*in_RCX != 7) {
      bignum_t<32>::bignum_t(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      dVar5 = bignum_t::operator_cast_to_double((bignum_t<32> *)0x346690);
      dVar5 = floor(dVar5);
      if ((2147483647.0 < dVar5 - (double)iVar1) || (dVar5 - (double)iVar1 < -2147483648.0)) {
        err_throw(0);
      }
      bignum_t<32>::operator-
                ((bignum_t<32> *)CONCAT35(in_stack_fffffffffffffed5,in_stack_fffffffffffffed0),
                 (double)in_RDI);
      bignum_t<32>::operator*
                ((bignum_t<32> *)CONCAT35(in_stack_fffffffffffffed5,in_stack_fffffffffffffed0),
                 (long)in_RDI);
      bignum_t::operator_cast_to_double((bignum_t<32> *)0x346730);
      round_int32((double)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      caldate_t::normalize
                ((int32_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (int32_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
    vVar3 = create((int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                   (int32_t)in_stack_fffffffffffffea0,
                   (int32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    vm_val_t::set_obj(in_RSI,vVar3);
  }
  return 1;
}

Assistant:

int CVmObjDate::sub_val(VMG_ vm_val_t *result, vm_obj_id_t /*self*/,
                        const vm_val_t *val)
{
    /* get my date and time */
    int32_t dayno = get_ext()->dayno;
    int32_t daytime = get_ext()->daytime;

    /* the other value must be a Date or something numeric */
    if (val->typ == VM_OBJ && is_date_obj(vmg_ val->val.obj))
    {
        /* get the other date's contents */
        CVmObjDate *vdate = (CVmObjDate *)vm_objp(vmg_ val->val.obj);
        int32_t vdayno = vdate->get_ext()->dayno;
        int32_t vdaytime = vdate->get_ext()->daytime;

        /* we need fractional days, so calculate as bignum_t */
        bignum_t<32> d1((long)dayno), t1((long)daytime);
        bignum_t<32> d2((long)vdayno), t2((long)vdaytime);
        d1 += (t1 / (long)(24*60*60*1000));
        d2 += (t2 / (long)(24*60*60*1000));

        /* return a BigNumber containing the result */
        result->set_obj(CVmObjBigNum::create(vmg_ FALSE, d1 - d2));

        /* handled (we don't want to return a Date, as the other paths do) */
        return TRUE;
    }
    else if (val->typ == VM_INT)
    {
        /* it's a simple integer - subtract the number of days */
        dayno -= val->val.intval;
    }
    else
    {
        /* it's not an int; calculate in the bignum domain */
        bignum_t<32> d(vmg_ val);

        /* make sure the integer portion won't overflow */
        double dd = floor((double)d);
        if (dd - dayno > INT32MAXVAL || dd - dayno < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);

        /* add the whole part to my day number */
        dayno -= (int32_t)dd;

        /* 
         *   convert the fractional part to milliseconds (by multiplying it
         *   by the number of milliseconds in a day), then subtract it from
         *   my time value 
         */
        daytime -= round_int32((double)((d - dd) * (long)(24L*60*60*1000)));

        /* normalize, to carry time overflow/underflow into the date */
        caldate_t::normalize(dayno, daytime);
    }

    /* return a new Date object representing the result */
    result->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* handled */
    return TRUE;
}